

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  RTCFilterFunctionN p_Var3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  Geometry *pGVar29;
  Scene *pSVar30;
  ulong *puVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_bf1;
  long local_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined8 local_b80;
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b70 [16];
  undefined1 local_b60 [16];
  long local_b48;
  long local_b40;
  ulong local_b38;
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0;
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar31 = local_7f8;
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar75 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar82 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar83 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  local_a90 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_aa0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_ab0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_a60 = local_a90 * 0.99999964;
  local_a70 = local_aa0 * 0.99999964;
  local_a80 = local_ab0 * 0.99999964;
  local_a90 = local_a90 * 1.0000004;
  local_aa0 = local_aa0 * 1.0000004;
  local_ab0 = local_ab0 * 1.0000004;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_b38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar33 = uVar32 ^ 0x10;
  uVar35 = local_b38 ^ 0x10;
  iVar23 = (tray->tnear).field_0.i[k];
  auVar95 = ZEXT1664(CONCAT412(iVar23,CONCAT48(iVar23,CONCAT44(iVar23,iVar23))));
  iVar23 = (tray->tfar).field_0.i[k];
  auVar96 = ZEXT1664(CONCAT412(iVar23,CONCAT48(iVar23,CONCAT44(iVar23,iVar23))));
  iVar23 = 1 << ((uint)k & 0x1f);
  auVar44._4_4_ = iVar23;
  auVar44._0_4_ = iVar23;
  auVar44._8_4_ = iVar23;
  auVar44._12_4_ = iVar23;
  auVar44._16_4_ = iVar23;
  auVar44._20_4_ = iVar23;
  auVar44._24_4_ = iVar23;
  auVar44._28_4_ = iVar23;
  auVar21 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar44 = vpand_avx2(auVar44,auVar21);
  local_940 = vpcmpeqd_avx2(auVar44,auVar21);
  bVar37 = true;
  fStack_a5c = local_a60;
  fStack_a58 = local_a60;
  fStack_a54 = local_a60;
  fStack_a6c = local_a70;
  fStack_a68 = local_a70;
  fStack_a64 = local_a70;
  fStack_a7c = local_a80;
  fStack_a78 = local_a80;
  fStack_a74 = local_a80;
  fStack_a8c = local_a90;
  fStack_a88 = local_a90;
  fStack_a84 = local_a90;
  fStack_a9c = local_aa0;
  fStack_a98 = local_aa0;
  fStack_a94 = local_aa0;
  fStack_aac = local_ab0;
  fStack_aa8 = local_ab0;
  fStack_aa4 = local_ab0;
  do {
    uVar34 = puVar31[-1];
    puVar31 = puVar31 + -1;
    while( true ) {
      local_a30 = auVar75._0_16_;
      local_ac0 = auVar95._0_16_;
      local_a40 = auVar82._0_16_;
      local_a50 = auVar83._0_16_;
      local_ad0 = auVar96._0_16_;
      if ((uVar34 & 8) != 0) break;
      uVar24 = uVar34 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar38._4_4_ = uVar1;
      auVar38._0_4_ = uVar1;
      auVar38._8_4_ = uVar1;
      auVar38._12_4_ = uVar1;
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar32),auVar38,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + uVar32));
      auVar39 = vsubps_avx(auVar39,local_a30);
      auVar45._0_4_ = local_a60 * auVar39._0_4_;
      auVar45._4_4_ = fStack_a5c * auVar39._4_4_;
      auVar45._8_4_ = fStack_a58 * auVar39._8_4_;
      auVar45._12_4_ = fStack_a54 * auVar39._12_4_;
      auVar39 = vmaxps_avx(local_ac0,auVar45);
      auVar77 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + local_b38),auVar38,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + local_b38));
      auVar77 = vsubps_avx(auVar77,local_a40);
      auVar51._0_4_ = local_a70 * auVar77._0_4_;
      auVar51._4_4_ = fStack_a6c * auVar77._4_4_;
      auVar51._8_4_ = fStack_a68 * auVar77._8_4_;
      auVar51._12_4_ = fStack_a64 * auVar77._12_4_;
      auVar77 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar27),auVar38,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + uVar27));
      auVar77 = vsubps_avx(auVar77,local_a50);
      auVar58._0_4_ = local_a80 * auVar77._0_4_;
      auVar58._4_4_ = fStack_a7c * auVar77._4_4_;
      auVar58._8_4_ = fStack_a78 * auVar77._8_4_;
      auVar58._12_4_ = fStack_a74 * auVar77._12_4_;
      auVar77 = vmaxps_avx(auVar51,auVar58);
      auVar39 = vmaxps_avx(auVar39,auVar77);
      auVar77 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar33),auVar38,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + uVar33));
      auVar77 = vsubps_avx(auVar77,local_a30);
      auVar52._0_4_ = local_a90 * auVar77._0_4_;
      auVar52._4_4_ = fStack_a8c * auVar77._4_4_;
      auVar52._8_4_ = fStack_a88 * auVar77._8_4_;
      auVar52._12_4_ = fStack_a84 * auVar77._12_4_;
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar35),auVar38,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + uVar35));
      auVar77 = vminps_avx(local_ad0,auVar52);
      auVar54 = vsubps_avx(auVar54,local_a40);
      auVar59._0_4_ = local_aa0 * auVar54._0_4_;
      auVar59._4_4_ = fStack_a9c * auVar54._4_4_;
      auVar59._8_4_ = fStack_a98 * auVar54._8_4_;
      auVar59._12_4_ = fStack_a94 * auVar54._12_4_;
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + (uVar27 ^ 0x10)),auVar38,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + (uVar27 ^ 0x10)));
      auVar54 = vsubps_avx(auVar54,local_a50);
      auVar63._0_4_ = local_ab0 * auVar54._0_4_;
      auVar63._4_4_ = fStack_aac * auVar54._4_4_;
      auVar63._8_4_ = fStack_aa8 * auVar54._8_4_;
      auVar63._12_4_ = fStack_aa4 * auVar54._12_4_;
      auVar54 = vminps_avx(auVar59,auVar63);
      auVar77 = vminps_avx(auVar77,auVar54);
      if (((uint)uVar34 & 7) == 6) {
        auVar77 = vcmpps_avx(auVar39,auVar77,2);
        auVar39 = vcmpps_avx(*(undefined1 (*) [16])(uVar24 + 0xe0),auVar38,2);
        auVar54 = vcmpps_avx(auVar38,*(undefined1 (*) [16])(uVar24 + 0xf0),1);
        auVar39 = vandps_avx(auVar39,auVar54);
        auVar39 = vandps_avx(auVar39,auVar77);
      }
      else {
        auVar39 = vcmpps_avx(auVar39,auVar77,2);
      }
      auVar39 = vpslld_avx(auVar39,0x1f);
      uVar25 = vmovmskps_avx(auVar39);
      if (uVar25 == 0) goto LAB_0056afcd;
      uVar25 = uVar25 & 0xff;
      lVar26 = 0;
      for (uVar34 = (ulong)uVar25; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar34 = *(ulong *)(uVar24 + lVar26 * 8);
      uVar25 = uVar25 - 1 & uVar25;
      uVar28 = (ulong)uVar25;
      if (uVar25 != 0) {
        *puVar31 = uVar34;
        lVar26 = 0;
        for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          lVar26 = lVar26 + 1;
        }
        uVar25 = uVar25 - 1 & uVar25;
        uVar28 = (ulong)uVar25;
        bVar36 = uVar25 == 0;
        while( true ) {
          puVar31 = puVar31 + 1;
          uVar34 = *(ulong *)(uVar24 + lVar26 * 8);
          if (bVar36) break;
          *puVar31 = uVar34;
          lVar26 = 0;
          for (uVar34 = uVar28; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
            lVar26 = lVar26 + 1;
          }
          uVar28 = uVar28 - 1 & uVar28;
          bVar36 = uVar28 == 0;
        }
      }
    }
    local_b40 = (ulong)((uint)uVar34 & 0xf) - 8;
    if (local_b40 != 0) {
      uVar34 = uVar34 & 0xfffffffffffffff0;
      local_b48 = 0;
      do {
        lVar26 = local_b48 * 0x140;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar64._4_4_ = uVar1;
        auVar64._0_4_ = uVar1;
        auVar64._8_4_ = uVar1;
        auVar64._12_4_ = uVar1;
        auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0x90 + lVar26),auVar64,
                                  *(undefined1 (*) [16])(uVar34 + lVar26));
        auVar77 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xa0 + lVar26),auVar64,
                                  *(undefined1 (*) [16])(uVar34 + 0x10 + lVar26));
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xb0 + lVar26),auVar64,
                                  *(undefined1 (*) [16])(uVar34 + 0x20 + lVar26));
        auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xc0 + lVar26),auVar64,
                                  *(undefined1 (*) [16])(uVar34 + 0x30 + lVar26));
        auVar71 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xd0 + lVar26),auVar64,
                                  *(undefined1 (*) [16])(uVar34 + 0x40 + lVar26));
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xe0 + lVar26),auVar64,
                                  *(undefined1 (*) [16])(uVar34 + 0x50 + lVar26));
        auVar66 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xf0 + lVar26),auVar64,
                                  *(undefined1 (*) [16])(uVar34 + 0x60 + lVar26));
        auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0x100 + lVar26),auVar64,
                                  *(undefined1 (*) [16])(uVar34 + 0x70 + lVar26));
        auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0x110 + lVar26),auVar64,
                                  *(undefined1 (*) [16])(uVar34 + 0x80 + lVar26));
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar65._4_4_ = uVar1;
        auVar65._0_4_ = uVar1;
        auVar65._8_4_ = uVar1;
        auVar65._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar92._4_4_ = uVar1;
        auVar92._0_4_ = uVar1;
        auVar92._8_4_ = uVar1;
        auVar92._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar94._4_4_ = uVar1;
        auVar94._0_4_ = uVar1;
        auVar94._8_4_ = uVar1;
        auVar94._12_4_ = uVar1;
        local_b60 = vsubps_avx(auVar39,auVar65);
        local_b70 = vsubps_avx(auVar77,auVar92);
        local_b90 = vsubps_avx(auVar54,auVar94);
        auVar39 = vsubps_avx(auVar70,auVar65);
        auVar77 = vsubps_avx(auVar71,auVar92);
        auVar54 = vsubps_avx(auVar47,auVar94);
        auVar70 = vsubps_avx(auVar66,auVar65);
        auVar71 = vsubps_avx(auVar76,auVar92);
        auVar47 = vsubps_avx(auVar40,auVar94);
        local_ba0 = vsubps_avx(auVar70,local_b60);
        local_bc0 = vsubps_avx(auVar71,local_b70);
        local_bb0 = vsubps_avx(auVar47,local_b90);
        auVar40._0_4_ = auVar70._0_4_ + local_b60._0_4_;
        auVar40._4_4_ = auVar70._4_4_ + local_b60._4_4_;
        auVar40._8_4_ = auVar70._8_4_ + local_b60._8_4_;
        auVar40._12_4_ = auVar70._12_4_ + local_b60._12_4_;
        auVar60._0_4_ = auVar71._0_4_ + local_b70._0_4_;
        auVar60._4_4_ = auVar71._4_4_ + local_b70._4_4_;
        auVar60._8_4_ = auVar71._8_4_ + local_b70._8_4_;
        auVar60._12_4_ = auVar71._12_4_ + local_b70._12_4_;
        fVar4 = local_b90._0_4_;
        auVar66._0_4_ = auVar47._0_4_ + fVar4;
        fVar5 = local_b90._4_4_;
        auVar66._4_4_ = auVar47._4_4_ + fVar5;
        fVar6 = local_b90._8_4_;
        auVar66._8_4_ = auVar47._8_4_ + fVar6;
        fVar7 = local_b90._12_4_;
        auVar66._12_4_ = auVar47._12_4_ + fVar7;
        auVar93._0_4_ = local_bb0._0_4_ * auVar60._0_4_;
        auVar93._4_4_ = local_bb0._4_4_ * auVar60._4_4_;
        auVar93._8_4_ = local_bb0._8_4_ * auVar60._8_4_;
        auVar93._12_4_ = local_bb0._12_4_ * auVar60._12_4_;
        auVar76 = vfmsub231ps_fma(auVar93,local_bc0,auVar66);
        auVar67._0_4_ = auVar66._0_4_ * local_ba0._0_4_;
        auVar67._4_4_ = auVar66._4_4_ * local_ba0._4_4_;
        auVar67._8_4_ = auVar66._8_4_ * local_ba0._8_4_;
        auVar67._12_4_ = auVar66._12_4_ * local_ba0._12_4_;
        auVar66 = vfmsub231ps_fma(auVar67,local_bb0,auVar40);
        auVar41._0_4_ = local_bc0._0_4_ * auVar40._0_4_;
        auVar41._4_4_ = local_bc0._4_4_ * auVar40._4_4_;
        auVar41._8_4_ = local_bc0._8_4_ * auVar40._8_4_;
        auVar41._12_4_ = local_bc0._12_4_ * auVar40._12_4_;
        auVar40 = vfmsub231ps_fma(auVar41,local_ba0,auVar60);
        local_b80._4_4_ = *(float *)(ray + k * 4 + 0xc0);
        auVar88._0_4_ = auVar40._0_4_ * local_b80._4_4_;
        auVar88._4_4_ = auVar40._4_4_ * local_b80._4_4_;
        auVar88._8_4_ = auVar40._8_4_ * local_b80._4_4_;
        auVar88._12_4_ = auVar40._12_4_ * local_b80._4_4_;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar91._4_4_ = uVar1;
        auVar91._0_4_ = uVar1;
        auVar91._8_4_ = uVar1;
        auVar91._12_4_ = uVar1;
        auVar66 = vfmadd231ps_fma(auVar88,auVar91,auVar66);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_be0._4_4_ = uVar1;
        local_be0._0_4_ = uVar1;
        local_be0._8_4_ = uVar1;
        local_be0._12_4_ = uVar1;
        local_a10 = vfmadd231ps_fma(auVar66,local_be0,auVar76);
        auVar66 = vsubps_avx(local_b70,auVar77);
        local_a00 = vsubps_avx(local_b90,auVar54);
        auVar61._0_4_ = local_b70._0_4_ + auVar77._0_4_;
        auVar61._4_4_ = local_b70._4_4_ + auVar77._4_4_;
        auVar61._8_4_ = local_b70._8_4_ + auVar77._8_4_;
        auVar61._12_4_ = local_b70._12_4_ + auVar77._12_4_;
        auVar68._0_4_ = fVar4 + auVar54._0_4_;
        auVar68._4_4_ = fVar5 + auVar54._4_4_;
        auVar68._8_4_ = fVar6 + auVar54._8_4_;
        auVar68._12_4_ = fVar7 + auVar54._12_4_;
        fVar8 = local_a00._0_4_;
        auVar76._0_4_ = auVar61._0_4_ * fVar8;
        fVar11 = local_a00._4_4_;
        auVar76._4_4_ = auVar61._4_4_ * fVar11;
        fVar14 = local_a00._8_4_;
        auVar76._8_4_ = auVar61._8_4_ * fVar14;
        fVar17 = local_a00._12_4_;
        auVar76._12_4_ = auVar61._12_4_ * fVar17;
        auVar41 = vfmsub231ps_fma(auVar76,auVar66,auVar68);
        auVar76 = vsubps_avx(local_b60,auVar39);
        fVar9 = auVar76._0_4_;
        auVar69._0_4_ = auVar68._0_4_ * fVar9;
        fVar12 = auVar76._4_4_;
        auVar69._4_4_ = auVar68._4_4_ * fVar12;
        fVar15 = auVar76._8_4_;
        auVar69._8_4_ = auVar68._8_4_ * fVar15;
        fVar18 = auVar76._12_4_;
        auVar69._12_4_ = auVar68._12_4_ * fVar18;
        auVar84._0_4_ = local_b60._0_4_ + auVar39._0_4_;
        auVar84._4_4_ = local_b60._4_4_ + auVar39._4_4_;
        auVar84._8_4_ = local_b60._8_4_ + auVar39._8_4_;
        auVar84._12_4_ = local_b60._12_4_ + auVar39._12_4_;
        auVar40 = vfmsub231ps_fma(auVar69,local_a00,auVar84);
        fVar10 = auVar66._0_4_;
        auVar85._0_4_ = auVar84._0_4_ * fVar10;
        fVar13 = auVar66._4_4_;
        auVar85._4_4_ = auVar84._4_4_ * fVar13;
        fVar16 = auVar66._8_4_;
        auVar85._8_4_ = auVar84._8_4_ * fVar16;
        fVar19 = auVar66._12_4_;
        auVar85._12_4_ = auVar84._12_4_ * fVar19;
        auVar46 = vfmsub231ps_fma(auVar85,auVar76,auVar61);
        auVar62._0_4_ = auVar46._0_4_ * local_b80._4_4_;
        auVar62._4_4_ = auVar46._4_4_ * local_b80._4_4_;
        auVar62._8_4_ = auVar46._8_4_ * local_b80._4_4_;
        auVar62._12_4_ = auVar46._12_4_ * local_b80._4_4_;
        auVar40 = vfmadd231ps_fma(auVar62,auVar91,auVar40);
        local_9e0 = vfmadd231ps_fma(auVar40,local_be0,auVar41);
        auVar40 = vsubps_avx(auVar39,auVar70);
        auVar53._0_4_ = auVar39._0_4_ + auVar70._0_4_;
        auVar53._4_4_ = auVar39._4_4_ + auVar70._4_4_;
        auVar53._8_4_ = auVar39._8_4_ + auVar70._8_4_;
        auVar53._12_4_ = auVar39._12_4_ + auVar70._12_4_;
        auVar70 = vsubps_avx(auVar77,auVar71);
        auVar46._0_4_ = auVar77._0_4_ + auVar71._0_4_;
        auVar46._4_4_ = auVar77._4_4_ + auVar71._4_4_;
        auVar46._8_4_ = auVar77._8_4_ + auVar71._8_4_;
        auVar46._12_4_ = auVar77._12_4_ + auVar71._12_4_;
        auVar71 = vsubps_avx(auVar54,auVar47);
        auVar39._0_4_ = auVar54._0_4_ + auVar47._0_4_;
        auVar39._4_4_ = auVar54._4_4_ + auVar47._4_4_;
        auVar39._8_4_ = auVar54._8_4_ + auVar47._8_4_;
        auVar39._12_4_ = auVar54._12_4_ + auVar47._12_4_;
        auVar77._0_4_ = auVar71._0_4_ * auVar46._0_4_;
        auVar77._4_4_ = auVar71._4_4_ * auVar46._4_4_;
        auVar77._8_4_ = auVar71._8_4_ * auVar46._8_4_;
        auVar77._12_4_ = auVar71._12_4_ * auVar46._12_4_;
        auVar77 = vfmsub231ps_fma(auVar77,auVar70,auVar39);
        auVar72._0_4_ = auVar39._0_4_ * auVar40._0_4_;
        auVar72._4_4_ = auVar39._4_4_ * auVar40._4_4_;
        auVar72._8_4_ = auVar39._8_4_ * auVar40._8_4_;
        auVar72._12_4_ = auVar39._12_4_ * auVar40._12_4_;
        auVar39 = vfmsub231ps_fma(auVar72,auVar71,auVar53);
        auVar54._0_4_ = auVar70._0_4_ * auVar53._0_4_;
        auVar54._4_4_ = auVar70._4_4_ * auVar53._4_4_;
        auVar54._8_4_ = auVar70._8_4_ * auVar53._8_4_;
        auVar54._12_4_ = auVar70._12_4_ * auVar53._12_4_;
        auVar54 = vfmsub231ps_fma(auVar54,auVar40,auVar46);
        local_b80._0_4_ = local_b80._4_4_;
        fStack_b78 = local_b80._4_4_;
        fStack_b74 = local_b80._4_4_;
        auVar47._0_4_ = auVar54._0_4_ * local_b80._4_4_;
        auVar47._4_4_ = auVar54._4_4_ * local_b80._4_4_;
        auVar47._8_4_ = auVar54._8_4_ * local_b80._4_4_;
        auVar47._12_4_ = auVar54._12_4_ * local_b80._4_4_;
        auVar39 = vfmadd231ps_fma(auVar47,auVar91,auVar39);
        auVar54 = vfmadd231ps_fma(auVar39,local_be0,auVar77);
        local_9f0 = local_a10._0_4_;
        fStack_9ec = local_a10._4_4_;
        fStack_9e8 = local_a10._8_4_;
        fStack_9e4 = local_a10._12_4_;
        local_9d0._0_4_ = auVar54._0_4_ + local_9f0 + local_9e0._0_4_;
        local_9d0._4_4_ = auVar54._4_4_ + fStack_9ec + local_9e0._4_4_;
        local_9d0._8_4_ = auVar54._8_4_ + fStack_9e8 + local_9e0._8_4_;
        local_9d0._12_4_ = auVar54._12_4_ + fStack_9e4 + local_9e0._12_4_;
        auVar55._8_4_ = 0x7fffffff;
        auVar55._0_8_ = 0x7fffffff7fffffff;
        auVar55._12_4_ = 0x7fffffff;
        auVar39 = vminps_avx(local_a10,local_9e0);
        auVar39 = vminps_avx(auVar39,auVar54);
        local_a20 = vandps_avx(local_9d0,auVar55);
        auVar86._0_4_ = local_a20._0_4_ * 1.1920929e-07;
        auVar86._4_4_ = local_a20._4_4_ * 1.1920929e-07;
        auVar86._8_4_ = local_a20._8_4_ * 1.1920929e-07;
        auVar86._12_4_ = local_a20._12_4_ * 1.1920929e-07;
        uVar24 = CONCAT44(auVar86._4_4_,auVar86._0_4_);
        auVar78._0_8_ = uVar24 ^ 0x8000000080000000;
        auVar78._8_4_ = -auVar86._8_4_;
        auVar78._12_4_ = -auVar86._12_4_;
        auVar39 = vcmpps_avx(auVar39,auVar78,5);
        auVar77 = vmaxps_avx(local_a10,local_9e0);
        auVar77 = vmaxps_avx(auVar77,auVar54);
        auVar77 = vcmpps_avx(auVar77,auVar86,2);
        auVar39 = vorps_avx(auVar39,auVar77);
        if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar39[0xf] < '\0') {
          auVar48._0_4_ = local_bb0._0_4_ * fVar10;
          auVar48._4_4_ = local_bb0._4_4_ * fVar13;
          auVar48._8_4_ = local_bb0._8_4_ * fVar16;
          auVar48._12_4_ = local_bb0._12_4_ * fVar19;
          auVar73._0_4_ = fVar9 * local_bc0._0_4_;
          auVar73._4_4_ = fVar12 * local_bc0._4_4_;
          auVar73._8_4_ = fVar15 * local_bc0._8_4_;
          auVar73._12_4_ = fVar18 * local_bc0._12_4_;
          auVar47 = vfmsub213ps_fma(local_bc0,local_a00,auVar48);
          auVar79._0_4_ = auVar70._0_4_ * fVar8;
          auVar79._4_4_ = auVar70._4_4_ * fVar11;
          auVar79._8_4_ = auVar70._8_4_ * fVar14;
          auVar79._12_4_ = auVar70._12_4_ * fVar17;
          auVar87._0_4_ = fVar9 * auVar71._0_4_;
          auVar87._4_4_ = fVar12 * auVar71._4_4_;
          auVar87._8_4_ = fVar15 * auVar71._8_4_;
          auVar87._12_4_ = fVar18 * auVar71._12_4_;
          auVar71 = vfmsub213ps_fma(auVar71,auVar66,auVar79);
          auVar77 = vandps_avx(auVar48,auVar55);
          auVar54 = vandps_avx(auVar79,auVar55);
          auVar77 = vcmpps_avx(auVar77,auVar54,1);
          local_970 = vblendvps_avx(auVar71,auVar47,auVar77);
          auVar80._0_4_ = auVar40._0_4_ * fVar10;
          auVar80._4_4_ = auVar40._4_4_ * fVar13;
          auVar80._8_4_ = auVar40._8_4_ * fVar16;
          auVar80._12_4_ = auVar40._12_4_ * fVar19;
          auVar71 = vfmsub213ps_fma(auVar40,local_a00,auVar87);
          auVar49._0_4_ = local_ba0._0_4_ * fVar8;
          auVar49._4_4_ = local_ba0._4_4_ * fVar11;
          auVar49._8_4_ = local_ba0._8_4_ * fVar14;
          auVar49._12_4_ = local_ba0._12_4_ * fVar17;
          auVar47 = vfmsub213ps_fma(local_bb0,auVar76,auVar49);
          auVar77 = vandps_avx(auVar49,auVar55);
          auVar54 = vandps_avx(auVar87,auVar55);
          auVar77 = vcmpps_avx(auVar77,auVar54,1);
          local_960 = vblendvps_avx(auVar71,auVar47,auVar77);
          auVar71 = vfmsub213ps_fma(local_ba0,auVar66,auVar73);
          auVar70 = vfmsub213ps_fma(auVar70,auVar76,auVar80);
          auVar77 = vandps_avx(auVar73,auVar55);
          auVar54 = vandps_avx(auVar80,auVar55);
          auVar77 = vcmpps_avx(auVar77,auVar54,1);
          local_950 = vblendvps_avx(auVar70,auVar71,auVar77);
          auVar70._0_4_ = local_950._0_4_ * local_b80._4_4_;
          auVar70._4_4_ = local_950._4_4_ * local_b80._4_4_;
          auVar70._8_4_ = local_950._8_4_ * local_b80._4_4_;
          auVar70._12_4_ = local_950._12_4_ * local_b80._4_4_;
          auVar77 = vfmadd213ps_fma(auVar91,local_960,auVar70);
          auVar77 = vfmadd213ps_fma(local_be0,local_970,auVar77);
          auVar74._0_4_ = auVar77._0_4_ + auVar77._0_4_;
          auVar74._4_4_ = auVar77._4_4_ + auVar77._4_4_;
          auVar74._8_4_ = auVar77._8_4_ + auVar77._8_4_;
          auVar74._12_4_ = auVar77._12_4_ + auVar77._12_4_;
          auVar71._0_4_ = local_950._0_4_ * fVar4;
          auVar71._4_4_ = local_950._4_4_ * fVar5;
          auVar71._8_4_ = local_950._8_4_ * fVar6;
          auVar71._12_4_ = local_950._12_4_ * fVar7;
          auVar77 = vfmadd213ps_fma(local_b70,local_960,auVar71);
          auVar54 = vfmadd213ps_fma(local_b60,local_970,auVar77);
          auVar77 = vrcpps_avx(auVar74);
          auVar89._8_4_ = 0x3f800000;
          auVar89._0_8_ = 0x3f8000003f800000;
          auVar89._12_4_ = 0x3f800000;
          auVar70 = vfnmadd213ps_fma(auVar77,auVar74,auVar89);
          auVar77 = vfmadd132ps_fma(auVar70,auVar77,auVar77);
          local_980._0_4_ = auVar77._0_4_ * (auVar54._0_4_ + auVar54._0_4_);
          local_980._4_4_ = auVar77._4_4_ * (auVar54._4_4_ + auVar54._4_4_);
          local_980._8_4_ = auVar77._8_4_ * (auVar54._8_4_ + auVar54._8_4_);
          local_980._12_4_ = auVar77._12_4_ * (auVar54._12_4_ + auVar54._12_4_);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar81._4_4_ = uVar1;
          auVar81._0_4_ = uVar1;
          auVar81._8_4_ = uVar1;
          auVar81._12_4_ = uVar1;
          auVar77 = vcmpps_avx(auVar81,local_980,2);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar90._4_4_ = uVar1;
          auVar90._0_4_ = uVar1;
          auVar90._8_4_ = uVar1;
          auVar90._12_4_ = uVar1;
          auVar75 = ZEXT1664(auVar90);
          auVar54 = vcmpps_avx(local_980,auVar90,2);
          auVar77 = vandps_avx(auVar54,auVar77);
          auVar54 = auVar39 & auVar77;
          if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar54[0xf] < '\0') {
            auVar39 = vandps_avx(auVar39,auVar77);
            auVar77 = vcmpps_avx(auVar74,_DAT_01f7aa10,4);
            local_9b0 = vandps_avx(auVar39,auVar77);
            uVar25 = vmovmskps_avx(local_9b0);
            if (uVar25 != 0) {
              lVar26 = lVar26 + uVar34;
              uStack_be8 = auVar91._8_8_;
              local_bf0 = lVar26;
              local_9c0 = &local_bf1;
              auVar39 = vrcpps_avx(local_9d0);
              auVar56._8_4_ = 0x3f800000;
              auVar56._0_8_ = 0x3f8000003f800000;
              auVar56._12_4_ = 0x3f800000;
              auVar77 = vfnmadd213ps_fma(local_9d0,auVar39,auVar56);
              auVar77 = vfmadd132ps_fma(auVar77,auVar39,auVar39);
              auVar50._8_4_ = 0x219392ef;
              auVar50._0_8_ = 0x219392ef219392ef;
              auVar50._12_4_ = 0x219392ef;
              auVar39 = vcmpps_avx(local_a20,auVar50,5);
              auVar39 = vandps_avx(auVar39,auVar77);
              auVar42._0_4_ = local_9f0 * auVar39._0_4_;
              auVar42._4_4_ = fStack_9ec * auVar39._4_4_;
              auVar42._8_4_ = fStack_9e8 * auVar39._8_4_;
              auVar42._12_4_ = fStack_9e4 * auVar39._12_4_;
              local_9a0 = vminps_avx(auVar42,auVar56);
              auVar43._0_4_ = auVar39._0_4_ * local_9e0._0_4_;
              auVar43._4_4_ = auVar39._4_4_ * local_9e0._4_4_;
              auVar43._8_4_ = auVar39._8_4_ * local_9e0._8_4_;
              auVar43._12_4_ = auVar39._12_4_ * local_9e0._12_4_;
              local_990 = vminps_avx(auVar43,auVar56);
              uVar24 = (ulong)(uVar25 & 0xff);
              local_b80 = context->scene;
              pSVar30 = context->scene;
              do {
                uVar28 = 0;
                for (uVar22 = uVar24; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  uVar28 = uVar28 + 1;
                }
                uVar25 = *(uint *)(lVar26 + 0x120 + uVar28 * 4);
                pGVar29 = (pSVar30->geometries).items[uVar25].ptr;
                if ((pGVar29->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  uVar24 = uVar24 ^ 1L << (uVar28 & 0x3f);
                  lVar26 = local_bf0;
                }
                else {
                  local_be0._0_8_ = uVar28;
                  local_b60._0_8_ = uVar24;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar29->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0056afe3:
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    return bVar37;
                  }
                  local_b70._0_8_ = pGVar29;
                  uVar24 = (ulong)(uint)((int)uVar28 * 4);
                  local_8c0 = *(undefined4 *)(local_9a0 + uVar24);
                  local_8a0 = *(undefined4 *)(local_990 + uVar24);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_980 + uVar24);
                  local_b30.context = context->user;
                  uVar1 = *(undefined4 *)(local_bf0 + 0x130 + uVar24);
                  local_880._4_4_ = uVar1;
                  local_880._0_4_ = uVar1;
                  local_880._8_4_ = uVar1;
                  local_880._12_4_ = uVar1;
                  local_880._16_4_ = uVar1;
                  local_880._20_4_ = uVar1;
                  local_880._24_4_ = uVar1;
                  local_880._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_970 + uVar24);
                  uVar2 = *(undefined4 *)(local_960 + uVar24);
                  local_900._4_4_ = uVar2;
                  local_900._0_4_ = uVar2;
                  local_900._8_4_ = uVar2;
                  local_900._12_4_ = uVar2;
                  local_900._16_4_ = uVar2;
                  local_900._20_4_ = uVar2;
                  local_900._24_4_ = uVar2;
                  local_900._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_950 + uVar24);
                  local_8e0._4_4_ = uVar2;
                  local_8e0._0_4_ = uVar2;
                  local_8e0._8_4_ = uVar2;
                  local_8e0._12_4_ = uVar2;
                  local_8e0._16_4_ = uVar2;
                  local_8e0._20_4_ = uVar2;
                  local_8e0._24_4_ = uVar2;
                  local_8e0._28_4_ = uVar2;
                  local_860._4_4_ = uVar25;
                  local_860._0_4_ = uVar25;
                  local_860._8_4_ = uVar25;
                  local_860._12_4_ = uVar25;
                  local_860._16_4_ = uVar25;
                  local_860._20_4_ = uVar25;
                  local_860._24_4_ = uVar25;
                  local_860._28_4_ = uVar25;
                  local_920[0] = (RTCHitN)(char)uVar1;
                  local_920[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[4] = (RTCHitN)(char)uVar1;
                  local_920[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[8] = (RTCHitN)(char)uVar1;
                  local_920[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0xc] = (RTCHitN)(char)uVar1;
                  local_920[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x10] = (RTCHitN)(char)uVar1;
                  local_920[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x14] = (RTCHitN)(char)uVar1;
                  local_920[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x18] = (RTCHitN)(char)uVar1;
                  local_920[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x1c] = (RTCHitN)(char)uVar1;
                  local_920[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  auVar44 = vpcmpeqd_avx2(local_860,local_860);
                  uStack_83c = (local_b30.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_b30.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_b00 = local_940;
                  local_b30.valid = (int *)local_b00;
                  local_b30.geometryUserPtr = pGVar29->userPtr;
                  local_b30.hit = local_920;
                  local_b30.N = 8;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar29->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_ba0._0_8_ = k;
                    local_b90._0_8_ = ray;
                    local_bb0._0_8_ = puVar31;
                    local_bc0._0_8_ = uVar32;
                    local_bd0 = auVar75._0_16_;
                    auVar44 = ZEXT1632(auVar44._0_16_);
                    (*pGVar29->occlusionFilterN)(&local_b30);
                    auVar75 = ZEXT1664(local_bd0);
                    auVar44 = vpcmpeqd_avx2(auVar44,auVar44);
                    k = local_ba0._0_8_;
                    pGVar29 = (Geometry *)local_b70._0_8_;
                    ray = (RayK<8> *)local_b90._0_8_;
                    puVar31 = (ulong *)local_bb0._0_8_;
                    uVar32 = local_bc0._0_8_;
                  }
                  auVar20 = vpcmpeqd_avx2(local_b00,_DAT_01faff00);
                  auVar21 = auVar44 & ~auVar20;
                  if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar21 >> 0x7f,0) == '\0') &&
                        (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar21 >> 0xbf,0) == '\0') &&
                      (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar21[0x1f]) {
                    auVar20 = auVar20 ^ auVar44;
                  }
                  else {
                    p_Var3 = context->args->filter;
                    if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                      local_ba0._0_8_ = k;
                      local_b90._0_8_ = ray;
                      local_bb0._0_8_ = puVar31;
                      local_bc0._0_8_ = uVar32;
                      local_bd0 = auVar75._0_16_;
                      auVar44 = ZEXT1632(auVar44._0_16_);
                      (*p_Var3)(&local_b30);
                      auVar75 = ZEXT1664(local_bd0);
                      auVar44 = vpcmpeqd_avx2(auVar44,auVar44);
                      k = local_ba0._0_8_;
                      ray = (RayK<8> *)local_b90._0_8_;
                      puVar31 = (ulong *)local_bb0._0_8_;
                      uVar32 = local_bc0._0_8_;
                    }
                    auVar21 = vpcmpeqd_avx2(local_b00,_DAT_01faff00);
                    auVar20 = auVar21 ^ auVar44;
                    auVar57._8_4_ = 0xff800000;
                    auVar57._0_8_ = 0xff800000ff800000;
                    auVar57._12_4_ = 0xff800000;
                    auVar57._16_4_ = 0xff800000;
                    auVar57._20_4_ = 0xff800000;
                    auVar57._24_4_ = 0xff800000;
                    auVar57._28_4_ = 0xff800000;
                    auVar44 = vblendvps_avx(auVar57,*(undefined1 (*) [32])(local_b30.ray + 0x100),
                                            auVar21);
                    *(undefined1 (*) [32])(local_b30.ray + 0x100) = auVar44;
                  }
                  if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar20 >> 0x7f,0) != '\0') ||
                        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar20 >> 0xbf,0) != '\0') ||
                      (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar20[0x1f] < '\0') goto LAB_0056afe3;
                  *(int *)(ray + k * 4 + 0x100) = auVar75._0_4_;
                  uVar24 = local_b60._0_8_ ^ 1L << (local_be0._0_8_ & 0x3f);
                  lVar26 = local_bf0;
                }
                pSVar30 = local_b80;
              } while (uVar24 != 0);
            }
          }
        }
        local_b48 = local_b48 + 1;
        auVar75 = ZEXT1664(local_a30);
        auVar82 = ZEXT1664(local_a40);
        auVar83 = ZEXT1664(local_a50);
        auVar95 = ZEXT1664(local_ac0);
        auVar96 = ZEXT1664(local_ad0);
      } while (local_b48 != local_b40);
    }
LAB_0056afcd:
    bVar37 = puVar31 != &local_800;
    if (!bVar37) {
      return bVar37;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }